

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_encoder.cc
# Opt level: O0

bool __thiscall
draco::SequentialIntegerAttributeEncoder::Init
          (SequentialIntegerAttributeEncoder *this,PointCloudEncoder *encoder,int attribute_id)

{
  bool bVar1;
  uint uVar2;
  DataType DVar3;
  PredictionSchemeMethod PVar4;
  PointAttribute *this_00;
  pointer pPVar5;
  undefined4 in_EDX;
  PointCloudEncoder *in_RSI;
  SequentialAttributeEncoder *in_RDI;
  PredictionSchemeMethod prediction_scheme_method;
  undefined4 in_stack_ffffffffffffffc8;
  PointCloudEncoder *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar6;
  bool local_1;
  
  bVar1 = SequentialAttributeEncoder::Init
                    ((SequentialAttributeEncoder *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    uVar2 = (*in_RDI->_vptr_SequentialAttributeEncoder[8])();
    if ((uVar2 & 0xff) == 1) {
      this_00 = SequentialAttributeEncoder::attribute(in_RDI);
      DVar3 = GeometryAttribute::data_type(&this_00->super_GeometryAttribute);
      if (5 < DVar3 - DT_INT8) {
        return false;
      }
    }
    uVar6 = in_EDX;
    PointCloudEncoder::options(in_RSI);
    PVar4 = GetPredictionMethodFromOptions
                      ((int)encoder,
                       (EncoderOptions *)CONCAT44(attribute_id,prediction_scheme_method));
    (*in_RDI->_vptr_SequentialAttributeEncoder[0xc])
              (&stack0xffffffffffffffd8,in_RDI,(ulong)(uint)PVar4);
    std::
    unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
    ::operator=((unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
                 *)in_RDI,
                (unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
                 *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8));
    std::
    unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
    ::~unique_ptr((unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
                   *)CONCAT44(uVar6,PVar4));
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
                        *)0x23d225);
    if (bVar1) {
      pPVar5 = std::
               unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
               ::get((unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
                      *)in_RDI);
      uVar2 = (*in_RDI->_vptr_SequentialAttributeEncoder[9])(in_RDI,pPVar5);
      if ((uVar2 & 1) == 0) {
        std::
        unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
        ::operator=((unique_ptr<draco::PredictionSchemeTypedEncoderInterface<int,_int>,_std::default_delete<draco::PredictionSchemeTypedEncoderInterface<int,_int>_>_>
                     *)in_RDI,(nullptr_t)CONCAT44(in_EDX,in_stack_ffffffffffffffc8));
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SequentialIntegerAttributeEncoder::Init(PointCloudEncoder *encoder,
                                             int attribute_id) {
  if (!SequentialAttributeEncoder::Init(encoder, attribute_id)) {
    return false;
  }
  if (GetUniqueId() == SEQUENTIAL_ATTRIBUTE_ENCODER_INTEGER) {
    // When encoding integers, this encoder currently works only for integer
    // attributes up to 32 bits.
    switch (attribute()->data_type()) {
      case DT_INT8:
      case DT_UINT8:
      case DT_INT16:
      case DT_UINT16:
      case DT_INT32:
      case DT_UINT32:
        break;
      default:
        return false;
    }
  }
  // Init prediction scheme.
  const PredictionSchemeMethod prediction_scheme_method =
      GetPredictionMethodFromOptions(attribute_id, *encoder->options());

  prediction_scheme_ = CreateIntPredictionScheme(prediction_scheme_method);

  if (prediction_scheme_ && !InitPredictionScheme(prediction_scheme_.get())) {
    prediction_scheme_ = nullptr;
  }

  return true;
}